

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_>
          *rng)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  char local_2b [3];
  
  local_2b[1] = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>(sout,local_2b + 1,1);
  piVar1 = (rng->base_).data_.
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Head_base<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
           ._M_head_impl._M_current;
  uVar3 = (long)(rng->base_).data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_head_impl._M_current - (long)piVar1 >> 2;
  if ((ulong)rng->count_ < uVar3) {
    uVar3 = rng->count_;
  }
  if (uVar3 != 0) {
    std::ostream::operator<<((ostream *)sout,*piVar1);
    if (uVar3 != 1) {
      lVar2 = 4;
      do {
        local_2b[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(sout,local_2b,1);
        std::ostream::operator<<((ostream *)sout,*(int *)((long)piVar1 + lVar2));
        lVar2 = lVar2 + 4;
      } while (uVar3 * 4 != lVar2);
    }
  }
  local_2b[2] = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>(sout,local_2b + 2,1);
  return sout;
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }